

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_AActor_A_DeQueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DThinker *pDVar2;
  AActor *pAVar3;
  AActor *this;
  char *__assertion;
  TThinkerIterator<DCorpsePointer> iterator;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004a7252;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004a7242:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004a7252:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x142,
                  "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this != (AActor *)0x0) {
      bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004a7252;
      }
      goto LAB_004a71f8;
    }
  }
  else if (this != (AActor *)0x0) goto LAB_004a7242;
  this = (AActor *)0x0;
LAB_004a71f8:
  TThinkerIterator<DCorpsePointer>::TThinkerIterator
            ((TThinkerIterator<DCorpsePointer> *)&iterator.super_FThinkerIterator,3);
  do {
    pDVar2 = FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
    if (pDVar2 == (DThinker *)0x0) {
      return 0;
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(pDVar2 + 1));
  } while (pAVar3 != this);
  pDVar2[1].super_DObject._vptr_DObject = (_func_int **)0x0;
  (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DeQueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *corpsePtr;

	while ((corpsePtr = iterator.Next()) != NULL)
	{
		if (corpsePtr->Corpse == self)
		{
			corpsePtr->Corpse = NULL;
			corpsePtr->Destroy ();
			return 0;
		}
	}
	return 0;
}